

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O0

Constant *
spvtools::opt::anon_unknown_0::FoldScalarFPDivide
          (Type *result_type,Constant *numerator,Constant *denominator,ConstantManager *const_mgr)

{
  uint uVar1;
  int iVar2;
  Type *pTVar3;
  undefined4 extraout_var;
  double dVar4;
  anon_class_1_0_00000001 local_49;
  Constant *local_48;
  Constant *result;
  FloatConstant *denominator_float;
  ConstantManager *pCStack_30;
  uint32_t width;
  ConstantManager *const_mgr_local;
  Constant *denominator_local;
  Constant *numerator_local;
  Type *result_type_local;
  
  if (denominator == (Constant *)0x0) {
    result_type_local = (Type *)0x0;
  }
  else {
    pCStack_30 = const_mgr;
    const_mgr_local = (ConstantManager *)denominator;
    denominator_local = numerator;
    numerator_local = (Constant *)result_type;
    uVar1 = (*denominator->_vptr_Constant[0x17])();
    if ((uVar1 & 1) == 0) {
      pTVar3 = analysis::Constant::type((Constant *)const_mgr_local);
      iVar2 = (*pTVar3->_vptr_Type[0xc])();
      denominator_float._4_4_ = analysis::Float::width((Float *)CONCAT44(extraout_var,iVar2));
      if ((denominator_float._4_4_ == 0x20) || (denominator_float._4_4_ == 0x40)) {
        result = (Constant *)
                 (*(code *)(const_mgr_local->ctx_->instr_to_block_)._M_h._M_bucket_count)();
        if (result != (Constant *)0x0) {
          dVar4 = analysis::Constant::GetValueAsDouble((Constant *)const_mgr_local);
          if ((dVar4 == -0.0) && (!NAN(dVar4))) {
            local_48 = FoldFPScalarDivideByZero
                                 ((Type *)numerator_local,denominator_local,pCStack_30);
            if (local_48 != (Constant *)0x0) {
              local_48 = NegateFPConst((Type *)numerator_local,local_48,pCStack_30);
            }
            return local_48;
          }
        }
        result_type_local =
             (Type *)FoldScalarFPDivide::anon_class_1_0_00000001::operator()
                               (&local_49,(Type *)numerator_local,denominator_local,
                                (Constant *)const_mgr_local,pCStack_30);
      }
      else {
        result_type_local = (Type *)0x0;
      }
    }
    else {
      result_type_local =
           (Type *)FoldFPScalarDivideByZero((Type *)numerator_local,denominator_local,pCStack_30);
    }
  }
  return (Constant *)result_type_local;
}

Assistant:

const analysis::Constant* FoldScalarFPDivide(
    const analysis::Type* result_type, const analysis::Constant* numerator,
    const analysis::Constant* denominator,
    analysis::ConstantManager* const_mgr) {
  if (denominator == nullptr) {
    return nullptr;
  }

  if (denominator->IsZero()) {
    return FoldFPScalarDivideByZero(result_type, numerator, const_mgr);
  }

  uint32_t width = denominator->type()->AsFloat()->width();
  if (width != 32 && width != 64) {
    return nullptr;
  }

  const analysis::FloatConstant* denominator_float =
      denominator->AsFloatConstant();
  if (denominator_float && denominator->GetValueAsDouble() == -0.0) {
    const analysis::Constant* result =
        FoldFPScalarDivideByZero(result_type, numerator, const_mgr);
    if (result != nullptr)
      result = NegateFPConst(result_type, result, const_mgr);
    return result;
  } else {
    return FOLD_FPARITH_OP(/)(result_type, numerator, denominator, const_mgr);
  }
}